

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O0

CURLcode rtsp_do(Curl_easy *data,_Bool *done)

{
  Curl_RtspReq CVar1;
  connectdata *conn_00;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *local_148;
  char *local_138;
  char *local_128;
  char *local_118;
  char *local_108;
  char *local_f8;
  char *local_e8;
  char *local_d8;
  size_t plen;
  curl_off_t req_clen;
  char *p_userpwd;
  char *p_proxyuserpwd;
  char *p_uagent;
  char *p_transport;
  char *p_stream_uri;
  char *p_referrer;
  char *p_range;
  char *p_accept_encoding;
  char *p_accept;
  char *p_session_id;
  char *p_request;
  dynbuf req_buffer;
  RTSP *rtsp;
  Curl_RtspReq rtspreq;
  CURLcode result;
  connectdata *conn;
  _Bool *done_local;
  Curl_easy *data_local;
  
  conn_00 = data->conn;
  rtsp._4_4_ = CURLE_OK;
  CVar1 = (data->set).rtspreq;
  req_buffer.toobig = *(size_t *)&(data->req).p;
  p_accept_encoding = (char *)0x0;
  p_range = (char *)0x0;
  p_referrer = (char *)0x0;
  p_proxyuserpwd = (char *)0x0;
  *done = true;
  Curl_dyn_init((dynbuf *)&p_request,0x10000);
  *(long *)req_buffer.toobig = (data->state).rtsp_next_client_CSeq;
  *(undefined8 *)(req_buffer.toobig + 8) = 0;
  if ((data->state).first_host == (char *)0x0) {
    pcVar3 = (*Curl_cstrdup)((conn_00->host).name);
    (data->state).first_host = pcVar3;
    if ((data->state).first_host == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    (data->state).first_remote_port = conn_00->remote_port;
    (data->state).first_remote_protocol = conn_00->handler->protocol;
  }
  *(uint *)&(data->req).field_0xd9 = *(uint *)&(data->req).field_0xd9 | 0x20000;
  switch(CVar1) {
  case RTSPREQ_OPTIONS:
    p_session_id = "OPTIONS";
    break;
  case RTSPREQ_DESCRIBE:
    p_session_id = "DESCRIBE";
    *(uint *)&(data->req).field_0xd9 = *(uint *)&(data->req).field_0xd9 & 0xfffdffff;
    break;
  case RTSPREQ_ANNOUNCE:
    p_session_id = "ANNOUNCE";
    break;
  case RTSPREQ_SETUP:
    p_session_id = "SETUP";
    break;
  case RTSPREQ_PLAY:
    p_session_id = "PLAY";
    break;
  case RTSPREQ_PAUSE:
    p_session_id = "PAUSE";
    break;
  case RTSPREQ_TEARDOWN:
    p_session_id = "TEARDOWN";
    break;
  case RTSPREQ_GET_PARAMETER:
    p_session_id = "GET_PARAMETER";
    *(uint *)&(data->req).field_0xd9 = *(uint *)&(data->req).field_0xd9 & 0xfffdffff;
    break;
  case RTSPREQ_SET_PARAMETER:
    p_session_id = "SET_PARAMETER";
    break;
  case RTSPREQ_RECORD:
    p_session_id = "RECORD";
    break;
  case RTSPREQ_RECEIVE:
    p_session_id = "";
    *(uint *)&(data->req).field_0xd9 = *(uint *)&(data->req).field_0xd9 & 0xfffdffff;
    break;
  case RTSPREQ_LAST:
    Curl_failf(data,"Got invalid RTSP request: RTSPREQ_LAST");
    return CURLE_BAD_FUNCTION_ARGUMENT;
  default:
    Curl_failf(data,"Got invalid RTSP request");
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  if (CVar1 == RTSPREQ_RECEIVE) {
    Curl_xfer_setup1(data,1,-1,true);
    goto LAB_00176c2a;
  }
  pcVar3 = (data->set).str[0x33];
  if ((pcVar3 == (char *)0x0) && ((CVar1 & ~RTSPREQ_TEARDOWN) != RTSPREQ_NONE)) {
    Curl_failf(data,"Refusing to issue an RTSP request [%s] without a session ID.",p_session_id);
    rtsp._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
    goto LAB_00176c2a;
  }
  if ((data->set).str[0x34] == (char *)0x0) {
    p_transport = "*";
  }
  else {
    p_transport = (data->set).str[0x34];
  }
  p_uagent = Curl_checkheaders(data,"Transport",9);
  if ((CVar1 == RTSPREQ_SETUP) && (p_uagent == (char *)0x0)) {
    if ((data->set).str[0x35] == (char *)0x0) {
      Curl_failf(data,"Refusing to issue an RTSP SETUP without a Transport: header.");
      rtsp._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
      goto LAB_00176c2a;
    }
    (*Curl_cfree)((data->state).aptr.rtsp_transport);
    (data->state).aptr.rtsp_transport = (char *)0x0;
    pcVar4 = curl_maprintf("Transport: %s\r\n",(data->set).str[0x35]);
    (data->state).aptr.rtsp_transport = pcVar4;
    if ((data->state).aptr.rtsp_transport == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    p_uagent = (data->state).aptr.rtsp_transport;
  }
  if (CVar1 == RTSPREQ_DESCRIBE) {
    pcVar4 = Curl_checkheaders(data,"Accept",6);
    p_accept_encoding = "Accept: application/sdp\r\n";
    if (pcVar4 != (char *)0x0) {
      p_accept_encoding = (char *)0x0;
    }
    pcVar4 = Curl_checkheaders(data,"Accept-Encoding",0xf);
    if ((pcVar4 == (char *)0x0) && ((data->set).str[0x21] != (char *)0x0)) {
      (*Curl_cfree)((data->state).aptr.accept_encoding);
      (data->state).aptr.accept_encoding = (char *)0x0;
      pcVar4 = curl_maprintf("Accept-Encoding: %s\r\n",(data->set).str[0x21]);
      (data->state).aptr.accept_encoding = pcVar4;
      if ((data->state).aptr.accept_encoding == (char *)0x0) {
        rtsp._4_4_ = CURLE_OUT_OF_MEMORY;
        goto LAB_00176c2a;
      }
      p_range = (data->state).aptr.accept_encoding;
    }
  }
  pcVar4 = Curl_checkheaders(data,"User-Agent",10);
  if ((pcVar4 == (char *)0x0) || ((data->state).aptr.uagent == (char *)0x0)) {
    pcVar4 = Curl_checkheaders(data,"User-Agent",10);
    if ((pcVar4 == (char *)0x0) && ((data->set).str[0x2b] != (char *)0x0)) {
      p_proxyuserpwd = (data->state).aptr.uagent;
    }
  }
  else {
    (*Curl_cfree)((data->state).aptr.uagent);
    (data->state).aptr.uagent = (char *)0x0;
  }
  rtsp._4_4_ = Curl_http_output_auth(data,conn_00,p_session_id,HTTPREQ_GET,p_transport,false);
  if (rtsp._4_4_ != CURLE_OK) goto LAB_00176c2a;
  local_138 = (data->state).aptr.proxyuserpwd;
  local_148 = (data->state).aptr.userpwd;
  (*Curl_cfree)((data->state).aptr.ref);
  (data->state).aptr.ref = (char *)0x0;
  if (((data->state).referer != (char *)0x0) &&
     (pcVar4 = Curl_checkheaders(data,"Referer",7), pcVar4 == (char *)0x0)) {
    pcVar4 = curl_maprintf("Referer: %s\r\n",(data->state).referer);
    (data->state).aptr.ref = pcVar4;
  }
  local_118 = (data->state).aptr.ref;
  if (((((*(uint *)&(data->state).field_0x744 >> 8 & 1) != 0) &&
       ((CVar1 & (RTSPREQ_LAST|RTSPREQ_ANNOUNCE)) != RTSPREQ_NONE)) &&
      (pcVar4 = Curl_checkheaders(data,"Range",5), pcVar4 == (char *)0x0)) &&
     ((data->state).range != (char *)0x0)) {
    (*Curl_cfree)((data->state).aptr.rangeline);
    (data->state).aptr.rangeline = (char *)0x0;
    pcVar4 = curl_maprintf("Range: %s\r\n",(data->state).range);
    (data->state).aptr.rangeline = pcVar4;
    p_referrer = (data->state).aptr.rangeline;
  }
  pcVar4 = Curl_checkheaders(data,"CSeq",4);
  if (pcVar4 != (char *)0x0) {
    Curl_failf(data,"CSeq cannot be set as a custom header.");
    rtsp._4_4_ = CURLE_RTSP_CSEQ_ERROR;
    goto LAB_00176c2a;
  }
  pcVar4 = Curl_checkheaders(data,"Session",7);
  if (pcVar4 != (char *)0x0) {
    Curl_failf(data,"Session ID cannot be set as a custom header.");
    rtsp._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
    goto LAB_00176c2a;
  }
  rtsp._4_4_ = Curl_dyn_addf((dynbuf *)&p_request,"%s %s RTSP/1.0\r\nCSeq: %ld\r\n",p_session_id,
                             p_transport,*(undefined8 *)req_buffer.toobig);
  if ((rtsp._4_4_ != CURLE_OK) ||
     ((pcVar3 != (char *)0x0 &&
      (rtsp._4_4_ = Curl_dyn_addf((dynbuf *)&p_request,"Session: %s\r\n",pcVar3),
      rtsp._4_4_ != CURLE_OK)))) goto LAB_00176c2a;
  if (p_uagent == (char *)0x0) {
    local_d8 = "";
  }
  else {
    local_d8 = p_uagent;
  }
  if (p_accept_encoding == (char *)0x0) {
    local_e8 = "";
  }
  else {
    local_e8 = p_accept_encoding;
  }
  if (p_range == (char *)0x0) {
    local_f8 = "";
  }
  else {
    local_f8 = p_range;
  }
  if (p_referrer == (char *)0x0) {
    local_108 = "";
  }
  else {
    local_108 = p_referrer;
  }
  if (local_118 == (char *)0x0) {
    local_118 = "";
  }
  if (p_proxyuserpwd == (char *)0x0) {
    local_128 = "";
  }
  else {
    local_128 = p_proxyuserpwd;
  }
  if (local_138 == (char *)0x0) {
    local_138 = "";
  }
  if (local_148 == (char *)0x0) {
    local_148 = "";
  }
  rtsp._4_4_ = Curl_dyn_addf((dynbuf *)&p_request,"%s%s%s%s%s%s%s%s",local_d8,local_e8,local_f8,
                             local_108,local_118,local_128,local_138,local_148);
  (*Curl_cfree)((data->state).aptr.userpwd);
  (data->state).aptr.userpwd = (char *)0x0;
  if (((rtsp._4_4_ != CURLE_OK) ||
      (((CVar1 == RTSPREQ_SETUP || (CVar1 == RTSPREQ_DESCRIBE)) &&
       (rtsp._4_4_ = Curl_add_timecondition(data,(dynbuf *)&p_request), rtsp._4_4_ != CURLE_OK))))
     || (rtsp._4_4_ = Curl_add_custom_headers(data,false,(dynbuf *)&p_request),
        rtsp._4_4_ != CURLE_OK)) goto LAB_00176c2a;
  if (((CVar1 == RTSPREQ_ANNOUNCE) || (CVar1 == RTSPREQ_SET_PARAMETER)) ||
     (CVar1 == RTSPREQ_GET_PARAMETER)) {
    if ((*(uint *)&(data->state).field_0x744 >> 0x11 & 1) == 0) {
      if ((data->set).postfields == (void *)0x0) {
        if ((data->state).infilesize < 0) {
          plen = 0;
          rtsp._4_4_ = Curl_creader_set_null(data);
        }
        else {
          plen = (data->state).infilesize;
          rtsp._4_4_ = Curl_creader_set_fread(data,plen);
        }
      }
      else {
        plen = strlen((char *)(data->set).postfields);
        rtsp._4_4_ = Curl_creader_set_buf(data,(char *)(data->set).postfields,plen);
      }
    }
    else {
      plen = (data->state).infilesize;
      (data->state).httpreq = '\x04';
      rtsp._4_4_ = Curl_creader_set_fread(data,plen);
    }
    if (rtsp._4_4_ != CURLE_OK) goto LAB_00176c2a;
    if ((long)plen < 1) {
      if (CVar1 == RTSPREQ_GET_PARAMETER) {
        (data->state).httpreq = '\x05';
        *(uint *)&(data->req).field_0xd9 = *(uint *)&(data->req).field_0xd9 & 0xfffdffff | 0x20000;
      }
    }
    else {
      pcVar3 = Curl_checkheaders(data,"Content-Length",0xe);
      if (((pcVar3 == (char *)0x0) &&
          (rtsp._4_4_ = Curl_dyn_addf((dynbuf *)&p_request,"Content-Length: %ld\r\n",plen),
          rtsp._4_4_ != CURLE_OK)) ||
         (((CVar1 == RTSPREQ_SET_PARAMETER || (CVar1 == RTSPREQ_GET_PARAMETER)) &&
          ((pcVar3 = Curl_checkheaders(data,"Content-Type",0xc), pcVar3 == (char *)0x0 &&
           (rtsp._4_4_ = Curl_dyn_addn((dynbuf *)&p_request,"Content-Type: text/parameters\r\n",0x1f
                                      ), rtsp._4_4_ != CURLE_OK)))))) goto LAB_00176c2a;
      if ((CVar1 == RTSPREQ_ANNOUNCE) &&
         (pcVar3 = Curl_checkheaders(data,"Content-Type",0xc), pcVar3 == (char *)0x0)) {
        rtsp._4_4_ = Curl_dyn_addn((dynbuf *)&p_request,"Content-Type: application/sdp\r\n",0x1f);
        goto joined_r0x00176b1b;
      }
    }
  }
  else {
    rtsp._4_4_ = Curl_creader_set_null(data);
joined_r0x00176b1b:
    if (rtsp._4_4_ != CURLE_OK) goto LAB_00176c2a;
  }
  rtsp._4_4_ = Curl_dyn_addn((dynbuf *)&p_request,"\r\n",2);
  if (rtsp._4_4_ == CURLE_OK) {
    Curl_xfer_setup1(data,3,-1,true);
    rtsp._4_4_ = Curl_req_send(data,(dynbuf *)&p_request);
    if (rtsp._4_4_ == CURLE_OK) {
      (data->state).rtsp_next_client_CSeq = (data->state).rtsp_next_client_CSeq + 1;
      if ((data->req).writebytecount != 0) {
        Curl_pgrsSetUploadCounter(data,(data->req).writebytecount);
        iVar2 = Curl_pgrsUpdate(data);
        if (iVar2 != 0) {
          rtsp._4_4_ = CURLE_ABORTED_BY_CALLBACK;
        }
      }
    }
    else {
      Curl_failf(data,"Failed sending RTSP request");
    }
  }
LAB_00176c2a:
  Curl_dyn_free((dynbuf *)&p_request);
  return rtsp._4_4_;
}

Assistant:

static CURLcode rtsp_do(struct Curl_easy *data, bool *done)
{
  struct connectdata *conn = data->conn;
  CURLcode result = CURLE_OK;
  Curl_RtspReq rtspreq = data->set.rtspreq;
  struct RTSP *rtsp = data->req.p.rtsp;
  struct dynbuf req_buffer;

  const char *p_request = NULL;
  const char *p_session_id = NULL;
  const char *p_accept = NULL;
  const char *p_accept_encoding = NULL;
  const char *p_range = NULL;
  const char *p_referrer = NULL;
  const char *p_stream_uri = NULL;
  const char *p_transport = NULL;
  const char *p_uagent = NULL;
  const char *p_proxyuserpwd = NULL;
  const char *p_userpwd = NULL;

  *done = TRUE;
  /* Initialize a dynamic send buffer */
  Curl_dyn_init(&req_buffer, DYN_RTSP_REQ_HEADER);

  rtsp->CSeq_sent = data->state.rtsp_next_client_CSeq;
  rtsp->CSeq_recv = 0;

  /* Setup the first_* fields to allow auth details get sent
     to this origin */

  if(!data->state.first_host) {
    data->state.first_host = strdup(conn->host.name);
    if(!data->state.first_host)
      return CURLE_OUT_OF_MEMORY;

    data->state.first_remote_port = conn->remote_port;
    data->state.first_remote_protocol = conn->handler->protocol;
  }

  /* Setup the 'p_request' pointer to the proper p_request string
   * Since all RTSP requests are included here, there is no need to
   * support custom requests like HTTP.
   **/
  data->req.no_body = TRUE; /* most requests do not contain a body */
  switch(rtspreq) {
  default:
    failf(data, "Got invalid RTSP request");
    return CURLE_BAD_FUNCTION_ARGUMENT;
  case RTSPREQ_OPTIONS:
    p_request = "OPTIONS";
    break;
  case RTSPREQ_DESCRIBE:
    p_request = "DESCRIBE";
    data->req.no_body = FALSE;
    break;
  case RTSPREQ_ANNOUNCE:
    p_request = "ANNOUNCE";
    break;
  case RTSPREQ_SETUP:
    p_request = "SETUP";
    break;
  case RTSPREQ_PLAY:
    p_request = "PLAY";
    break;
  case RTSPREQ_PAUSE:
    p_request = "PAUSE";
    break;
  case RTSPREQ_TEARDOWN:
    p_request = "TEARDOWN";
    break;
  case RTSPREQ_GET_PARAMETER:
    /* GET_PARAMETER's no_body status is determined later */
    p_request = "GET_PARAMETER";
    data->req.no_body = FALSE;
    break;
  case RTSPREQ_SET_PARAMETER:
    p_request = "SET_PARAMETER";
    break;
  case RTSPREQ_RECORD:
    p_request = "RECORD";
    break;
  case RTSPREQ_RECEIVE:
    p_request = "";
    /* Treat interleaved RTP as body */
    data->req.no_body = FALSE;
    break;
  case RTSPREQ_LAST:
    failf(data, "Got invalid RTSP request: RTSPREQ_LAST");
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }

  if(rtspreq == RTSPREQ_RECEIVE) {
    Curl_xfer_setup1(data, CURL_XFER_RECV, -1, TRUE);
    goto out;
  }

  p_session_id = data->set.str[STRING_RTSP_SESSION_ID];
  if(!p_session_id &&
     (rtspreq & ~(Curl_RtspReq)(RTSPREQ_OPTIONS |
                                RTSPREQ_DESCRIBE |
                                RTSPREQ_SETUP))) {
    failf(data, "Refusing to issue an RTSP request [%s] without a session ID.",
          p_request);
    result = CURLE_BAD_FUNCTION_ARGUMENT;
    goto out;
  }

  /* Stream URI. Default to server '*' if not specified */
  if(data->set.str[STRING_RTSP_STREAM_URI]) {
    p_stream_uri = data->set.str[STRING_RTSP_STREAM_URI];
  }
  else {
    p_stream_uri = "*";
  }

  /* Transport Header for SETUP requests */
  p_transport = Curl_checkheaders(data, STRCONST("Transport"));
  if(rtspreq == RTSPREQ_SETUP && !p_transport) {
    /* New Transport: setting? */
    if(data->set.str[STRING_RTSP_TRANSPORT]) {
      Curl_safefree(data->state.aptr.rtsp_transport);

      data->state.aptr.rtsp_transport =
        aprintf("Transport: %s\r\n",
                data->set.str[STRING_RTSP_TRANSPORT]);
      if(!data->state.aptr.rtsp_transport)
        return CURLE_OUT_OF_MEMORY;
    }
    else {
      failf(data,
            "Refusing to issue an RTSP SETUP without a Transport: header.");
      result = CURLE_BAD_FUNCTION_ARGUMENT;
      goto out;
    }

    p_transport = data->state.aptr.rtsp_transport;
  }

  /* Accept Headers for DESCRIBE requests */
  if(rtspreq == RTSPREQ_DESCRIBE) {
    /* Accept Header */
    p_accept = Curl_checkheaders(data, STRCONST("Accept"))?
      NULL:"Accept: application/sdp\r\n";

    /* Accept-Encoding header */
    if(!Curl_checkheaders(data, STRCONST("Accept-Encoding")) &&
       data->set.str[STRING_ENCODING]) {
      Curl_safefree(data->state.aptr.accept_encoding);
      data->state.aptr.accept_encoding =
        aprintf("Accept-Encoding: %s\r\n", data->set.str[STRING_ENCODING]);

      if(!data->state.aptr.accept_encoding) {
        result = CURLE_OUT_OF_MEMORY;
        goto out;
      }
      p_accept_encoding = data->state.aptr.accept_encoding;
    }
  }

  /* The User-Agent string might have been allocated in url.c already, because
     it might have been used in the proxy connect, but if we have got a header
     with the user-agent string specified, we erase the previously made string
     here. */
  if(Curl_checkheaders(data, STRCONST("User-Agent")) &&
     data->state.aptr.uagent) {
    Curl_safefree(data->state.aptr.uagent);
  }
  else if(!Curl_checkheaders(data, STRCONST("User-Agent")) &&
          data->set.str[STRING_USERAGENT]) {
    p_uagent = data->state.aptr.uagent;
  }

  /* setup the authentication headers */
  result = Curl_http_output_auth(data, conn, p_request, HTTPREQ_GET,
                                 p_stream_uri, FALSE);
  if(result)
    goto out;

#ifndef CURL_DISABLE_PROXY
  p_proxyuserpwd = data->state.aptr.proxyuserpwd;
#endif
  p_userpwd = data->state.aptr.userpwd;

  /* Referrer */
  Curl_safefree(data->state.aptr.ref);
  if(data->state.referer && !Curl_checkheaders(data, STRCONST("Referer")))
    data->state.aptr.ref = aprintf("Referer: %s\r\n", data->state.referer);

  p_referrer = data->state.aptr.ref;

  /*
   * Range Header
   * Only applies to PLAY, PAUSE, RECORD
   *
   * Go ahead and use the Range stuff supplied for HTTP
   */
  if(data->state.use_range &&
     (rtspreq  & (RTSPREQ_PLAY | RTSPREQ_PAUSE | RTSPREQ_RECORD))) {

    /* Check to see if there is a range set in the custom headers */
    if(!Curl_checkheaders(data, STRCONST("Range")) && data->state.range) {
      Curl_safefree(data->state.aptr.rangeline);
      data->state.aptr.rangeline = aprintf("Range: %s\r\n", data->state.range);
      p_range = data->state.aptr.rangeline;
    }
  }

  /*
   * Sanity check the custom headers
   */
  if(Curl_checkheaders(data, STRCONST("CSeq"))) {
    failf(data, "CSeq cannot be set as a custom header.");
    result = CURLE_RTSP_CSEQ_ERROR;
    goto out;
  }
  if(Curl_checkheaders(data, STRCONST("Session"))) {
    failf(data, "Session ID cannot be set as a custom header.");
    result = CURLE_BAD_FUNCTION_ARGUMENT;
    goto out;
  }

  result =
    Curl_dyn_addf(&req_buffer,
                  "%s %s RTSP/1.0\r\n" /* Request Stream-URI RTSP/1.0 */
                  "CSeq: %ld\r\n", /* CSeq */
                  p_request, p_stream_uri, rtsp->CSeq_sent);
  if(result)
    goto out;

  /*
   * Rather than do a normal alloc line, keep the session_id unformatted
   * to make comparison easier
   */
  if(p_session_id) {
    result = Curl_dyn_addf(&req_buffer, "Session: %s\r\n", p_session_id);
    if(result)
      goto out;
  }

  /*
   * Shared HTTP-like options
   */
  result = Curl_dyn_addf(&req_buffer,
                         "%s" /* transport */
                         "%s" /* accept */
                         "%s" /* accept-encoding */
                         "%s" /* range */
                         "%s" /* referrer */
                         "%s" /* user-agent */
                         "%s" /* proxyuserpwd */
                         "%s" /* userpwd */
                         ,
                         p_transport ? p_transport : "",
                         p_accept ? p_accept : "",
                         p_accept_encoding ? p_accept_encoding : "",
                         p_range ? p_range : "",
                         p_referrer ? p_referrer : "",
                         p_uagent ? p_uagent : "",
                         p_proxyuserpwd ? p_proxyuserpwd : "",
                         p_userpwd ? p_userpwd : "");

  /*
   * Free userpwd now --- cannot reuse this for Negotiate and possibly NTLM
   * with basic and digest, it will be freed anyway by the next request
   */
  Curl_safefree(data->state.aptr.userpwd);

  if(result)
    goto out;

  if((rtspreq == RTSPREQ_SETUP) || (rtspreq == RTSPREQ_DESCRIBE)) {
    result = Curl_add_timecondition(data, &req_buffer);
    if(result)
      goto out;
  }

  result = Curl_add_custom_headers(data, FALSE, &req_buffer);
  if(result)
    goto out;

  if(rtspreq == RTSPREQ_ANNOUNCE ||
     rtspreq == RTSPREQ_SET_PARAMETER ||
     rtspreq == RTSPREQ_GET_PARAMETER) {
    curl_off_t req_clen; /* request content length */

    if(data->state.upload) {
      req_clen = data->state.infilesize;
      data->state.httpreq = HTTPREQ_PUT;
      result = Curl_creader_set_fread(data, req_clen);
      if(result)
        goto out;
    }
    else {
      if(data->set.postfields) {
        size_t plen = strlen(data->set.postfields);
        req_clen = (curl_off_t)plen;
        result = Curl_creader_set_buf(data, data->set.postfields, plen);
      }
      else if(data->state.infilesize >= 0) {
        req_clen = data->state.infilesize;
        result = Curl_creader_set_fread(data, req_clen);
      }
      else {
        req_clen = 0;
        result = Curl_creader_set_null(data);
      }
      if(result)
        goto out;
    }

    if(req_clen > 0) {
      /* As stated in the http comments, it is probably not wise to
       * actually set a custom Content-Length in the headers */
      if(!Curl_checkheaders(data, STRCONST("Content-Length"))) {
        result =
          Curl_dyn_addf(&req_buffer, "Content-Length: %" FMT_OFF_T"\r\n",
                        req_clen);
        if(result)
          goto out;
      }

      if(rtspreq == RTSPREQ_SET_PARAMETER ||
         rtspreq == RTSPREQ_GET_PARAMETER) {
        if(!Curl_checkheaders(data, STRCONST("Content-Type"))) {
          result = Curl_dyn_addn(&req_buffer,
                                 STRCONST("Content-Type: "
                                          "text/parameters\r\n"));
          if(result)
            goto out;
        }
      }

      if(rtspreq == RTSPREQ_ANNOUNCE) {
        if(!Curl_checkheaders(data, STRCONST("Content-Type"))) {
          result = Curl_dyn_addn(&req_buffer,
                                 STRCONST("Content-Type: "
                                          "application/sdp\r\n"));
          if(result)
            goto out;
        }
      }
    }
    else if(rtspreq == RTSPREQ_GET_PARAMETER) {
      /* Check for an empty GET_PARAMETER (heartbeat) request */
      data->state.httpreq = HTTPREQ_HEAD;
      data->req.no_body = TRUE;
    }
  }
  else {
    result = Curl_creader_set_null(data);
    if(result)
      goto out;
  }

  /* Finish the request buffer */
  result = Curl_dyn_addn(&req_buffer, STRCONST("\r\n"));
  if(result)
    goto out;

  Curl_xfer_setup1(data, CURL_XFER_SENDRECV, -1, TRUE);

  /* issue the request */
  result = Curl_req_send(data, &req_buffer);
  if(result) {
    failf(data, "Failed sending RTSP request");
    goto out;
  }

  /* Increment the CSeq on success */
  data->state.rtsp_next_client_CSeq++;

  if(data->req.writebytecount) {
    /* if a request-body has been sent off, we make sure this progress is
       noted properly */
    Curl_pgrsSetUploadCounter(data, data->req.writebytecount);
    if(Curl_pgrsUpdate(data))
      result = CURLE_ABORTED_BY_CALLBACK;
  }
out:
  Curl_dyn_free(&req_buffer);
  return result;
}